

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

shared_ptr<duckdb::StandardColumnData,_true>
duckdb::SharedConstructor::
Create<duckdb::StandardColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
          (BlockManager *args,DataTableInfo *args_1,unsigned_long *args_2,unsigned_long *args_3,
          LogicalType *args_4,optional_ptr<duckdb::ColumnData,_true> *args_5)

{
  element_type *in_RDI;
  shared_ptr<duckdb::StandardColumnData,_true> sVar1;
  unsigned_long *unaff_retaddr;
  unsigned_long *in_stack_00000008;
  DataTableInfo *in_stack_00000010;
  
  sVar1 = make_shared_ptr<duckdb::StandardColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
                    ((BlockManager *)args_4,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                     (LogicalType *)in_RDI,(optional_ptr<duckdb::ColumnData,_true> *)args_1);
  sVar1.internal.super___shared_ptr<duckdb::StandardColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<duckdb::StandardColumnData,_true>)
         sVar1.internal.super___shared_ptr<duckdb::StandardColumnData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<T> Create(ARGS &&...args) {
		return make_shared_ptr<T>(std::forward<ARGS>(args)...);
	}